

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::fillChannels(Rand48 *random,DeepImageLevel *level)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  DeepImageChannel *pDVar5;
  DeepImageLevel *in_RSI;
  Iterator *in_RDI;
  Iterator i;
  Iterator *in_stack_ffffffffffffff98;
  Iterator *in_stack_ffffffffffffffa0;
  SampleCountChannel *in_stack_ffffffffffffffd8;
  Rand48 *in_stack_ffffffffffffffe0;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"             sample counts ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imf_3_2::DeepImageLevel::sampleCounts(in_RSI);
  fillSampleCounts(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Imf_3_2::DeepImageLevel::begin();
  do {
    Imf_3_2::DeepImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Imf_3_2::DeepImageLevel::end();
    Imf_3_2::DeepImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    bVar1 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffffa0,
                                (ConstIterator *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      return;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"             channel ");
    psVar4 = Imf_3_2::DeepImageLevel::Iterator::name_abi_cxx11_((Iterator *)0x114c9c);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pDVar5 = Imf_3_2::DeepImageLevel::Iterator::channel((Iterator *)0x114cc2);
    iVar2 = (*(code *)**(undefined8 **)pDVar5)();
    if (iVar2 == 0) {
      in_stack_ffffffffffffff98 = in_RDI;
      Imf_3_2::DeepImageLevel::Iterator::channel((Iterator *)0x114d48);
      fillChannel<unsigned_int>
                (in_stack_ffffffffffffffe0,(DeepImageChannel *)in_stack_ffffffffffffffd8);
    }
    else if (iVar2 == 1) {
      Imf_3_2::DeepImageLevel::Iterator::channel((Iterator *)0x114d03);
      fillChannel<Imath_3_2::half>
                (in_stack_ffffffffffffffe0,(DeepImageChannel *)in_stack_ffffffffffffffd8);
    }
    else {
      if (iVar2 != 2) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                      ,0xed,"void (anonymous namespace)::fillChannels(Rand48 &, DeepImageLevel &)");
      }
      in_stack_ffffffffffffffa0 = in_RDI;
      Imf_3_2::DeepImageLevel::Iterator::channel((Iterator *)0x114d26);
      fillChannel<float>(in_stack_ffffffffffffffe0,(DeepImageChannel *)in_stack_ffffffffffffffd8);
    }
    Imf_3_2::DeepImageLevel::Iterator::operator++(in_stack_ffffffffffffffa0);
  } while( true );
}

Assistant:

void
fillChannels (Rand48& random, DeepImageLevel& level)
{
    cout << "             sample counts " << endl;
    fillSampleCounts (random, level.sampleCounts ());

    for (DeepImageLevel::Iterator i = level.begin (); i != level.end (); ++i)
    {
        cout << "             channel " << i.name () << endl;

        switch (i.channel ().pixelType ())
        {
            case HALF: fillChannel<half> (random, i.channel ()); break;

            case FLOAT: fillChannel<float> (random, i.channel ()); break;

            case UINT: fillChannel<unsigned int> (random, i.channel ()); break;

            default: assert (false);
        }
    }
}